

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lode_png_test_bitreader(uchar *data,size_t size,size_t numsteps,size_t *steps,uint *result)

{
  uint uVar1;
  long in_RCX;
  ulong in_RDX;
  long in_R8;
  uint ok;
  size_t step;
  uint error;
  LodePNGBitReader reader;
  size_t i;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uchar *in_stack_ffffffffffffff90;
  LodePNGBitReader *reader_00;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  LodePNGBitReader local_60;
  ulong local_38;
  long local_30;
  long local_28;
  ulong local_20;
  uint local_4;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  uVar1 = LodePNGBitReader_init
                    ((LodePNGBitReader *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     in_stack_ffffffffffffff90,
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (uVar1 == 0) {
    for (local_38 = 0; local_38 < local_20; local_38 = local_38 + 1) {
      reader_00 = *(LodePNGBitReader **)(local_28 + local_38 * 8);
      if (reader_00 < (LodePNGBitReader *)0x1a) {
        if (reader_00 < (LodePNGBitReader *)0x12) {
          if (reader_00 < (LodePNGBitReader *)0xa) {
            uVar1 = ensureBits9(&local_60,(size_t)reader_00);
          }
          else {
            uVar1 = ensureBits17(&local_60,(size_t)reader_00);
          }
        }
        else {
          uVar1 = ensureBits25(&local_60,(size_t)reader_00);
        }
      }
      else {
        uVar1 = ensureBits32(&local_60,(size_t)reader_00);
      }
      if (uVar1 == 0) {
        return 0;
      }
      uVar1 = readBits(reader_00,CONCAT44(uVar1,in_stack_ffffffffffffff88));
      *(uint *)(local_30 + local_38 * 4) = uVar1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

unsigned lode_png_test_bitreader(const unsigned char* data, size_t size,
                                 size_t numsteps, const size_t* steps, unsigned* result) {
  size_t i;
  LodePNGBitReader reader;
  unsigned error = LodePNGBitReader_init(&reader, data, size);
  if(error) return 0;
  for(i = 0; i < numsteps; i++) {
    size_t step = steps[i];
    unsigned ok;
    if(step > 25) ok = ensureBits32(&reader, step);
    else if(step > 17) ok = ensureBits25(&reader, step);
    else if(step > 9) ok = ensureBits17(&reader, step);
    else ok = ensureBits9(&reader, step);
    if(!ok) return 0;
    result[i] = readBits(&reader, step);
  }
  return 1;
}